

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_fillreadbuffer(Curl_easy *data,size_t bytes,size_t *nreadp)

{
  dynbuf *pdVar1;
  char **ppcVar2;
  int *piVar3;
  undefined1 *puVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  Curl_easy *pCVar13;
  code *pcVar14;
  size_t __n;
  Curl_easy *data_1;
  curl_slist *trailers;
  undefined1 local_40 [7];
  uint uStack_39;
  
  if ((data->state).trailers_state == TRAILERS_INITIALIZED) {
    local_40 = (undefined1  [7])0x0;
    uStack_39 = uStack_39 & 0xffffff00;
    Curl_infof(data,"Moving trailers state machine from initialized to sending.");
    (data->state).trailers_state = TRAILERS_SENDING;
    pdVar1 = &(data->state).trailers_buf;
    Curl_dyn_init(pdVar1,0x10000);
    (data->state).trailers_bytes_sent = 0;
    Curl_set_in_callback(data,true);
    iVar6 = (*(data->set).trailer_callback)((curl_slist **)local_40,(data->set).trailer_data);
    Curl_set_in_callback(data,false);
    if (iVar6 == 0) {
      CVar7 = Curl_http_compile_trailers
                        ((curl_slist *)CONCAT17((undefined1)uStack_39,local_40),pdVar1,data);
    }
    else {
      Curl_failf(data,"operation aborted by trailing headers callback");
      *nreadp = 0;
      CVar7 = CURLE_ABORTED_BY_CALLBACK;
    }
    if (CVar7 == CURLE_OK) {
      Curl_infof(data,"Successfully compiled trailers.");
    }
    else {
      Curl_dyn_free(pdVar1);
    }
    curl_slist_free_all((curl_slist *)CONCAT17((undefined1)uStack_39,local_40));
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
  }
  if ((((data->req).field_0xd9 & 0x80) != 0) && ((data->state).trailers_state == TRAILERS_NONE)) {
    bytes = bytes - 0xc;
    ppcVar2 = &(data->req).upload_fromhere;
    *ppcVar2 = *ppcVar2 + 10;
  }
  if ((data->state).trailers_state == TRAILERS_SENDING) {
    pcVar14 = trailers_read;
    pCVar13 = data;
  }
  else {
    pcVar14 = (data->state).fread_func;
    pCVar13 = (Curl_easy *)(data->state).in;
  }
  Curl_set_in_callback(data,true);
  sVar8 = (*pcVar14)((data->req).upload_fromhere,1,bytes,pCVar13);
  Curl_set_in_callback(data,false);
  if (sVar8 == 0x10000001) {
    if ((data->conn->handler->flags & 0x10) == 0) {
      piVar3 = &(data->req).keepon;
      *(byte *)piVar3 = (byte)*piVar3 | 0x20;
      if (((data->req).field_0xd9 & 0x80) != 0) {
        ppcVar2 = &(data->req).upload_fromhere;
        *ppcVar2 = *ppcVar2 + -10;
      }
      *nreadp = 0;
      return CURLE_OK;
    }
    pcVar11 = "Read callback asked for PAUSE when not supported";
LAB_0011ccce:
    Curl_failf(data,pcVar11);
    return CURLE_READ_ERROR;
  }
  if (sVar8 == 0x10000000) {
    Curl_failf(data,"operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if (bytes < sVar8) {
    *nreadp = 0;
    pcVar11 = "read function returned funny value";
    goto LAB_0011ccce;
  }
  if ((*(ushort *)&(data->req).field_0xd9 & 0x280) != 0x80) goto LAB_0011ce4c;
  if (((data->state).field_0x6d1 & 0x80) == 0) {
    pcVar11 = "\n";
    if (((data->set).field_0x8e2 & 8) == 0) {
      pcVar11 = "\r\n";
    }
  }
  else {
    pcVar11 = "\n";
  }
  if ((data->state).trailers_state == TRAILERS_SENDING) {
    bVar5 = false;
    __n = 0;
  }
  else {
    local_40 = (undefined1  [7])0x0;
    uStack_39 = 0;
    iVar6 = curl_msnprintf(local_40,0xb,"%zx%s",sVar8);
    __n = (size_t)iVar6;
    pcVar12 = (data->req).upload_fromhere + -__n;
    (data->req).upload_fromhere = pcVar12;
    sVar9 = sVar8 + __n;
    memcpy(pcVar12,local_40,__n);
    if (((sVar8 == 0) && ((data->set).trailer_callback != (curl_trailer_callback)0x0)) &&
       ((data->state).trailers_state == TRAILERS_NONE)) {
      (data->state).trailers_state = TRAILERS_INITIALIZED;
      bVar5 = false;
      sVar8 = sVar9;
    }
    else {
      pcVar12 = (data->req).upload_fromhere;
      sVar10 = strlen(pcVar11);
      memcpy(pcVar12 + sVar9,pcVar11,sVar10);
      bVar5 = true;
      sVar8 = sVar9;
    }
  }
  if ((data->state).trailers_state == TRAILERS_SENDING) {
    pdVar1 = &(data->state).trailers_buf;
    sVar9 = Curl_dyn_len(pdVar1);
    if (sVar9 != (data->state).trailers_bytes_sent) goto LAB_0011ce0b;
    Curl_dyn_free(pdVar1);
    (data->state).trailers_state = TRAILERS_DONE;
    (data->set).trailer_data = (void *)0x0;
    (data->set).trailer_callback = (curl_trailer_callback)0x0;
    pcVar12 = "Signaling end of chunked upload after trailers.";
LAB_0011ce21:
    puVar4 = &(data->req).field_0xd9;
    *puVar4 = *puVar4 | 4;
    Curl_infof(data,pcVar12);
  }
  else {
LAB_0011ce0b:
    if ((sVar8 == __n) && ((data->state).trailers_state != TRAILERS_INITIALIZED)) {
      pcVar12 = "Signaling end of chunked upload via terminating chunk.";
      goto LAB_0011ce21;
    }
  }
  if (bVar5) {
    sVar10 = strlen(pcVar11);
    sVar8 = sVar10 + sVar8;
  }
LAB_0011ce4c:
  *nreadp = sVar8;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct Curl_easy *data, size_t bytes,
                             size_t *nreadp)
{
  size_t buffersize = bytes;
  size_t nread;

  curl_read_callback readfunc = NULL;
  void *extra_data = NULL;

#ifndef CURL_DISABLE_HTTP
  if(data->state.trailers_state == TRAILERS_INITIALIZED) {
    struct curl_slist *trailers = NULL;
    CURLcode result;
    int trailers_ret_code;

    /* at this point we already verified that the callback exists
       so we compile and store the trailers buffer, then proceed */
    infof(data,
          "Moving trailers state machine from initialized to sending.");
    data->state.trailers_state = TRAILERS_SENDING;
    Curl_dyn_init(&data->state.trailers_buf, DYN_TRAILERS);

    data->state.trailers_bytes_sent = 0;
    Curl_set_in_callback(data, true);
    trailers_ret_code = data->set.trailer_callback(&trailers,
                                                   data->set.trailer_data);
    Curl_set_in_callback(data, false);
    if(trailers_ret_code == CURL_TRAILERFUNC_OK) {
      result = Curl_http_compile_trailers(trailers, &data->state.trailers_buf,
                                          data);
    }
    else {
      failf(data, "operation aborted by trailing headers callback");
      *nreadp = 0;
      result = CURLE_ABORTED_BY_CALLBACK;
    }
    if(result) {
      Curl_dyn_free(&data->state.trailers_buf);
      curl_slist_free_all(trailers);
      return result;
    }
    infof(data, "Successfully compiled trailers.");
    curl_slist_free_all(trailers);
  }
#endif

#ifndef CURL_DISABLE_HTTP
  /* if we are transmitting trailing data, we don't need to write
     a chunk size so we skip this */
  if(data->req.upload_chunky &&
     data->state.trailers_state == TRAILERS_NONE) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

  if(data->state.trailers_state == TRAILERS_SENDING) {
    /* if we're here then that means that we already sent the last empty chunk
       but we didn't send a final CR LF, so we sent 0 CR LF. We then start
       pulling trailing data until we have no more at which point we
       simply return to the previous point in the state machine as if
       nothing happened.
       */
    readfunc = trailers_read;
    extra_data = (void *)data;
  }
  else
#endif
  {
    readfunc = data->state.fread_func;
    extra_data = data->state.in;
  }

  Curl_set_in_callback(data, true);
  nread = readfunc(data->req.upload_fromhere, 1,
                   buffersize, extra_data);
  Curl_set_in_callback(data, false);

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(data->conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

#ifndef CURL_DISABLE_HTTP
  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on state.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    bool added_crlf = FALSE;
    int hexlen = 0;
    const char *endofline_native;
    const char *endofline_network;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->state.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }

    /* if we're not handling trailing data, proceed as usual */
    if(data->state.trailers_state != TRAILERS_SENDING) {
      char hexbuffer[11] = "";
      hexlen = msnprintf(hexbuffer, sizeof(hexbuffer),
                         "%zx%s", nread, endofline_native);

      /* move buffer pointer */
      data->req.upload_fromhere -= hexlen;
      nread += hexlen;

      /* copy the prefix to the buffer, leaving out the NUL */
      memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

      /* always append ASCII CRLF to the data unless
         we have a valid trailer callback */
      if((nread-hexlen) == 0 &&
          data->set.trailer_callback != NULL &&
          data->state.trailers_state == TRAILERS_NONE) {
        data->state.trailers_state = TRAILERS_INITIALIZED;
      }
      else {
        memcpy(data->req.upload_fromhere + nread,
               endofline_network,
               strlen(endofline_network));
        added_crlf = TRUE;
      }
    }

    if(data->state.trailers_state == TRAILERS_SENDING &&
       !trailers_left(data)) {
      Curl_dyn_free(&data->state.trailers_buf);
      data->state.trailers_state = TRAILERS_DONE;
      data->set.trailer_data = NULL;
      data->set.trailer_callback = NULL;
      /* mark the transfer as done */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload after trailers.");
    }
    else
      if((nread - hexlen) == 0 &&
         data->state.trailers_state != TRAILERS_INITIALIZED) {
        /* mark this as done once this chunk is transferred */
        data->req.upload_done = TRUE;
        infof(data,
              "Signaling end of chunked upload via terminating chunk.");
      }

    if(added_crlf)
      nread += strlen(endofline_network); /* for the added end of line */
  }
#endif

  *nreadp = nread;

  return CURLE_OK;
}